

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabwidget.cpp
# Opt level: O0

void __thiscall QTabWidget::setTabVisible(QTabWidget *this,int index,bool visible)

{
  byte bVar1;
  QTabWidgetPrivate *pQVar2;
  QWidget *pQVar3;
  undefined1 in_DL;
  undefined4 in_ESI;
  QTabBar *in_RDI;
  bool currentVisible;
  QWidget *widget;
  QTabWidgetPrivate *d;
  int index_00;
  QStackedWidget *in_stack_ffffffffffffffd0;
  QTabBar *this_00;
  undefined1 onlyCheck;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  undefined3 in_stack_fffffffffffffff0;
  uint uVar4;
  
  uVar4 = CONCAT13(in_DL,in_stack_fffffffffffffff0) & 0x1ffffff;
  pQVar2 = d_func((QTabWidget *)0x6e6997);
  pQVar3 = QStackedWidget::widget(in_stack_ffffffffffffffd0,(int)((ulong)in_RDI >> 0x20));
  this_00 = pQVar2->tabs;
  QTabBar::currentIndex(in_RDI);
  index_00 = (int)((ulong)in_RDI >> 0x20);
  bVar1 = QTabBar::isTabVisible
                    ((QTabBar *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                     (int)((ulong)this_00 >> 0x20));
  QTabBar::setTabVisible
            ((QTabBar *)CONCAT44(in_ESI,uVar4),(int)((ulong)pQVar2 >> 0x20),
             SUB81((ulong)pQVar2 >> 0x18,0));
  if ((uVar4 & 0x1000000) == 0) {
    if (pQVar3 != (QWidget *)0x0) {
      (**(code **)(*(long *)pQVar3 + 0x68))(pQVar3,0);
    }
    onlyCheck = (undefined1)((ulong)this_00 >> 0x38);
  }
  else {
    if (((bVar1 & 1) == 0) &&
       (setCurrentIndex((QTabWidget *)this_00,index_00), pQVar3 != (QWidget *)0x0)) {
      (**(code **)(*(long *)pQVar3 + 0x68))(pQVar3,1);
    }
    onlyCheck = (undefined1)((ulong)this_00 >> 0x38);
  }
  setUpLayout((QTabWidget *)CONCAT17(bVar1,in_stack_ffffffffffffffd8),(bool)onlyCheck);
  return;
}

Assistant:

void QTabWidget::setTabVisible(int index, bool visible)
{
    Q_D(QTabWidget);
    QWidget *widget = d->stack->widget(index);
    bool currentVisible = d->tabs->isTabVisible(d->tabs->currentIndex());
    d->tabs->setTabVisible(index, visible);
    if (!visible) {
        if (widget)
            widget->setVisible(false);
    } else if (!currentVisible) {
        setCurrentIndex(index);
        if (widget)
            widget->setVisible(true);
    }
    setUpLayout();
}